

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

Stream * __thiscall kratos::Stream::operator<<(Stream *this,shared_ptr<kratos::Var> *var)

{
  undefined1 *puVar1;
  ostream *poVar2;
  Var *in_RDX;
  Var *extraout_RDX;
  element_type *this_00;
  undefined1 local_48 [8];
  string var_str;
  
  this_00 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((this_00->super_IRNode).comment._M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)&(this->super_stringstream).field_0x10,"// ");
    strip_newline((string *)local_48,
                  &(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   super_IRNode).comment);
    poVar2 = std::operator<<(poVar2,(string *)local_48);
    puVar1 = &(this->super_stringstream).field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)local_48);
    this_00 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    in_RDX = extraout_RDX;
  }
  if (*(char *)(*(long *)&(this->super_stringstream).field_0x80 + 0xbc) == '\x01') {
    (this_00->super_IRNode).verilog_ln = *(uint32_t *)&(this->super_stringstream).field_0x90;
  }
  get_var_decl_abi_cxx11_((string *)local_48,(Stream *)this_00,in_RDX);
  poVar2 = std::operator<<((ostream *)&(this->super_stringstream).field_0x10,
                           (string *)
                           &((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->before_var_str_);
  poVar2 = std::operator<<(poVar2,(string *)local_48);
  poVar2 = std::operator<<(poVar2,(string *)
                                  &((var->
                                    super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr)->after_var_str_);
  poVar2 = std::operator<<(poVar2,";");
  puVar1 = &(this->super_stringstream).field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)local_48);
  return this;
}

Assistant:

Stream& Stream::operator<<(const std::shared_ptr<Var>& var) {
    if (!var->comment.empty()) (*this) << "// " << strip_newline(var->comment) << endl();

    if (generator_->debug) {
        var->verilog_ln = line_no_;
    }

    auto var_str = get_var_decl(var.get());

    (*this) << var->before_var_str() << var_str << var->after_var_str() << ";" << endl();
    return *this;
}